

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

int GetCombinedHistogramEntropy
              (VP8LHistogram *a,VP8LHistogram *b,double cost_threshold,double *cost)

{
  int length;
  uint uVar1;
  uint trivial_at_end;
  double dVar2;
  double dVar3;
  
  length = (1 << ((byte)a->palette_code_bits_ & 0x1f)) + 0x118;
  if (a->palette_code_bits_ < 1) {
    length = 0x118;
  }
  dVar2 = GetCombinedEntropy(a->literal_,b->literal_,length,(uint)a->is_used_[0],
                             (uint)b->is_used_[0],0);
  *cost = dVar2 + *cost;
  dVar3 = (*VP8LExtraCostCombined)(a->literal_ + 0x100,b->literal_ + 0x100,0x18);
  dVar2 = *cost;
  *cost = dVar3 + dVar2;
  uVar1 = 0;
  if (dVar3 + dVar2 <= cost_threshold) {
    uVar1 = a->trivial_symbol_;
    trivial_at_end = 0;
    if ((((uVar1 != 0xffffffff) && (uVar1 == b->trivial_symbol_)) && (uVar1 + 0x1000000 < 0x2000000)
        ) && (((char)(uVar1 >> 0x10) == -1 || ((uVar1 >> 0x10 & 0xff) == 0)))) {
      trivial_at_end = (uint)((uVar1 & 0xff) == 0 || (uVar1 & 0xff) == 0xff);
    }
    dVar3 = GetCombinedEntropy(a->red_,b->red_,0x100,(uint)a->is_used_[1],(uint)b->is_used_[1],
                               trivial_at_end);
    dVar2 = *cost;
    *cost = dVar3 + dVar2;
    uVar1 = 0;
    if (dVar3 + dVar2 <= cost_threshold) {
      dVar3 = GetCombinedEntropy(a->blue_,b->blue_,0x100,(uint)a->is_used_[2],(uint)b->is_used_[2],
                                 trivial_at_end);
      dVar2 = *cost;
      *cost = dVar3 + dVar2;
      if (dVar3 + dVar2 <= cost_threshold) {
        dVar3 = GetCombinedEntropy(a->alpha_,b->alpha_,0x100,(uint)a->is_used_[3],
                                   (uint)b->is_used_[3],trivial_at_end);
        dVar2 = *cost;
        *cost = dVar3 + dVar2;
        uVar1 = 0;
        if (dVar3 + dVar2 <= cost_threshold) {
          dVar2 = GetCombinedEntropy(a->distance_,b->distance_,0x28,(uint)a->is_used_[4],
                                     (uint)b->is_used_[4],0);
          *cost = dVar2 + *cost;
          dVar3 = (*VP8LExtraCostCombined)(a->distance_,b->distance_,0x28);
          dVar2 = *cost;
          *cost = dVar3 + dVar2;
          uVar1 = (uint)(dVar3 + dVar2 <= cost_threshold);
        }
      }
    }
  }
  return uVar1;
}

Assistant:

static int GetCombinedHistogramEntropy(const VP8LHistogram* const a,
                                       const VP8LHistogram* const b,
                                       double cost_threshold,
                                       double* cost) {
  const int palette_code_bits = a->palette_code_bits_;
  int trivial_at_end = 0;
  assert(a->palette_code_bits_ == b->palette_code_bits_);
  *cost += GetCombinedEntropy(a->literal_, b->literal_,
                              VP8LHistogramNumCodes(palette_code_bits),
                              a->is_used_[0], b->is_used_[0], 0);
  *cost += VP8LExtraCostCombined(a->literal_ + NUM_LITERAL_CODES,
                                 b->literal_ + NUM_LITERAL_CODES,
                                 NUM_LENGTH_CODES);
  if (*cost > cost_threshold) return 0;

  if (a->trivial_symbol_ != VP8L_NON_TRIVIAL_SYM &&
      a->trivial_symbol_ == b->trivial_symbol_) {
    // A, R and B are all 0 or 0xff.
    const uint32_t color_a = (a->trivial_symbol_ >> 24) & 0xff;
    const uint32_t color_r = (a->trivial_symbol_ >> 16) & 0xff;
    const uint32_t color_b = (a->trivial_symbol_ >> 0) & 0xff;
    if ((color_a == 0 || color_a == 0xff) &&
        (color_r == 0 || color_r == 0xff) &&
        (color_b == 0 || color_b == 0xff)) {
      trivial_at_end = 1;
    }
  }

  *cost +=
      GetCombinedEntropy(a->red_, b->red_, NUM_LITERAL_CODES, a->is_used_[1],
                         b->is_used_[1], trivial_at_end);
  if (*cost > cost_threshold) return 0;

  *cost +=
      GetCombinedEntropy(a->blue_, b->blue_, NUM_LITERAL_CODES, a->is_used_[2],
                         b->is_used_[2], trivial_at_end);
  if (*cost > cost_threshold) return 0;

  *cost +=
      GetCombinedEntropy(a->alpha_, b->alpha_, NUM_LITERAL_CODES,
                         a->is_used_[3], b->is_used_[3], trivial_at_end);
  if (*cost > cost_threshold) return 0;

  *cost +=
      GetCombinedEntropy(a->distance_, b->distance_, NUM_DISTANCE_CODES,
                         a->is_used_[4], b->is_used_[4], 0);
  *cost +=
      VP8LExtraCostCombined(a->distance_, b->distance_, NUM_DISTANCE_CODES);
  if (*cost > cost_threshold) return 0;

  return 1;
}